

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O3

int main(void)

{
  _Head_base<0UL,_Buffer::Members_*,_false> _Var1;
  uchar *puVar2;
  uchar *puVar3;
  ostream *poVar4;
  Buffer *pBVar5;
  size_t sVar6;
  logic_error *this;
  size_t in_RCX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *src_01;
  EVP_PKEY_CTX *src_02;
  uchar *mbuf;
  Buffer bc3;
  size_t len;
  Buffer b1;
  Buffer bm4;
  Buffer bm1;
  Buffer bc4;
  Buffer bc2;
  Buffer bc1;
  Buffer bm5;
  Buffer bm2;
  Pl_Count count;
  Buffer bm6;
  Buffer bm3;
  Pl_Buffer bp1;
  Pl_Buffer bp4;
  Pl_Buffer bp3;
  Pl_Buffer bp2;
  uchar lbuf [10];
  Pl_Discard discard;
  uchar *local_1e0;
  Buffer local_1d8;
  size_t local_1d0;
  Buffer local_1c8;
  Buffer local_1c0;
  Buffer local_1b8;
  Buffer local_1b0;
  Buffer local_1a8;
  Buffer local_1a0;
  Buffer local_198;
  Buffer local_190;
  undefined1 local_188 [56];
  Buffer local_150;
  Buffer local_148;
  Pl_Buffer local_140;
  Pl_Buffer local_108;
  Pl_Buffer local_d0;
  Pl_Buffer local_98;
  uchar local_5a [10];
  Pipeline local_50;
  
  Buffer::Buffer(&local_1a0,2);
  puVar2 = Buffer::getBuffer(&local_1a0);
  puVar2[0] = 'Q';
  puVar2[1] = 'W';
  Buffer::copy(&local_1a8,(EVP_PKEY_CTX *)&local_1a0,src);
  *puVar2 = 'R';
  puVar3 = Buffer::getBuffer(&local_1a8);
  if (puVar3 == puVar2) {
    __assert_fail("bc2p != bc1p",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                  ,0x1d,"int main()");
  }
  if (*puVar3 != 'Q') {
    __assert_fail("bc2p[0] == \'Q\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                  ,0x1e,"int main()");
  }
  if (puVar3[1] != 'W') {
    __assert_fail("bc2p[1] == \'W\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                  ,0x1f,"int main()");
  }
  Buffer::copy((Buffer *)local_188,(EVP_PKEY_CTX *)&local_1a0,src_00);
  Buffer::operator=(&local_1a8,(Buffer *)local_188);
  Buffer::~Buffer((Buffer *)local_188);
  puVar3 = Buffer::getBuffer(&local_1a8);
  if (puVar3 == puVar2) {
    __assert_fail("bc2p != bc1p",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                  ,0x22,"int main()");
  }
  if (*puVar3 != 'R') {
    __assert_fail("bc2p[0] == \'R\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                  ,0x23,"int main()");
  }
  if (puVar3[1] != 'W') {
    __assert_fail("bc2p[1] == \'W\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                  ,0x24,"int main()");
  }
  _Var1._M_head_impl = (Members *)(local_188 + 0x10);
  local_188._0_8_ = _Var1._M_head_impl;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"QW","");
  Buffer::Buffer(&local_1d8,(string *)local_188);
  if ((Members *)local_188._0_8_ != _Var1._M_head_impl) {
    operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
  }
  puVar2 = Buffer::getBuffer(&local_1d8);
  Buffer::copy(&local_1b0,(EVP_PKEY_CTX *)&local_1d8,src_01);
  *puVar2 = 'R';
  puVar3 = Buffer::getBuffer(&local_1b0);
  if (puVar3 == puVar2) {
    __assert_fail("bc4p != bc3p",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                  ,0x2c,"int main()");
  }
  if (*puVar3 != 'Q') {
    __assert_fail("bc4p[0] == \'Q\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                  ,0x2d,"int main()");
  }
  if (puVar3[1] != 'W') {
    __assert_fail("bc4p[1] == \'W\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                  ,0x2e,"int main()");
  }
  Buffer::copy((Buffer *)local_188,(EVP_PKEY_CTX *)&local_1d8,src_02);
  Buffer::operator=(&local_1b0,(Buffer *)local_188);
  Buffer::~Buffer((Buffer *)local_188);
  puVar3 = Buffer::getBuffer(&local_1b0);
  if (puVar3 == puVar2) {
    __assert_fail("bc4p != bc3p",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                  ,0x31,"int main()");
  }
  if (*puVar3 != 'R') {
    __assert_fail("bc4p[0] == \'R\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                  ,0x32,"int main()");
  }
  if (puVar3[1] != 'W') {
    __assert_fail("bc4p[1] == \'W\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                  ,0x33,"int main()");
  }
  Buffer::Buffer(&local_1b8,2);
  puVar2 = Buffer::getBuffer(&local_1b8);
  puVar2[0] = 'Q';
  puVar2[1] = 'W';
  Buffer::Buffer(&local_190,&local_1b8);
  *puVar2 = 'R';
  puVar3 = Buffer::getBuffer(&local_190);
  if (puVar3 != puVar2) {
    __assert_fail("bm2p == bm1p",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                  ,0x3d,"int main()");
  }
  if (*puVar3 != 'R') {
    __assert_fail("bm2p[0] == \'R\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                  ,0x3e,"int main()");
  }
  Buffer::Buffer(&local_148,&local_190);
  puVar3 = Buffer::getBuffer(&local_148);
  if (puVar3 != puVar2) {
    __assert_fail("bm3p == bm2p",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                  ,0x42,"int main()");
  }
  local_188._0_8_ = _Var1._M_head_impl;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"QW","");
  Buffer::Buffer(&local_1c0,(string *)local_188);
  if ((Members *)local_188._0_8_ != _Var1._M_head_impl) {
    operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
  }
  puVar2 = Buffer::getBuffer(&local_1c0);
  Buffer::Buffer(&local_198,&local_1c0);
  *puVar2 = 'R';
  puVar3 = Buffer::getBuffer(&local_198);
  if (puVar3 != puVar2) {
    __assert_fail("bm5p == bm4p",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                  ,0x4a,"int main()");
  }
  if (*puVar3 != 'R') {
    __assert_fail("bm5p[0] == \'R\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                  ,0x4b,"int main()");
  }
  Buffer::Buffer(&local_150,&local_198);
  puVar3 = Buffer::getBuffer(&local_150);
  if (puVar3 == puVar2) {
    Pl_Discard::Pl_Discard((Pl_Discard *)&local_50);
    Pl_Count::Pl_Count((Pl_Count *)local_188,"count",&local_50);
    Pl_Buffer::Pl_Buffer(&local_140,"bp1",(Pipeline *)local_188);
    puVar2 = QUtil::unsigned_char_pointer("12345");
    Pl_Buffer::write(&local_140,(int)puVar2,(void *)0x5,in_RCX);
    puVar2 = QUtil::unsigned_char_pointer("67890");
    Pl_Buffer::write(&local_140,(int)puVar2,(void *)0x5,in_RCX);
    Pl_Buffer::finish(&local_140);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"count: ",7);
    Pl_Count::getCount((Pl_Count *)local_188);
    poVar4 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
    std::endl<char,std::char_traits<char>>(poVar4);
    puVar2 = QUtil::unsigned_char_pointer("abcde");
    Pl_Buffer::write(&local_140,(int)puVar2,(void *)0x5,in_RCX);
    puVar2 = QUtil::unsigned_char_pointer("fghij");
    Pl_Buffer::write(&local_140,(int)puVar2,(void *)0x6,in_RCX);
    Pl_Buffer::finish(&local_140);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"count: ",7);
    Pl_Count::getCount((Pl_Count *)local_188);
    poVar4 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
    std::endl<char,std::char_traits<char>>(poVar4);
    pBVar5 = Pl_Buffer::getBuffer(&local_140);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"size: ",6);
    Buffer::getSize(pBVar5);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"data: ",6);
    puVar2 = Buffer::getBuffer(pBVar5);
    poVar4 = std::operator<<((ostream *)&std::cout,puVar2);
    std::endl<char,std::char_traits<char>>(poVar4);
    Buffer::~Buffer(pBVar5);
    operator_delete(pBVar5,8);
    puVar2 = QUtil::unsigned_char_pointer("qwert");
    Pl_Buffer::write(&local_140,(int)puVar2,(void *)0x5,in_RCX);
    puVar2 = QUtil::unsigned_char_pointer("yuiop");
    Pl_Buffer::write(&local_140,(int)puVar2,(void *)0x6,in_RCX);
    Pl_Buffer::finish(&local_140);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"count: ",7);
    Pl_Count::getCount((Pl_Count *)local_188);
    poVar4 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
    std::endl<char,std::char_traits<char>>(poVar4);
    pBVar5 = Pl_Buffer::getBuffer(&local_140);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"size: ",6);
    Buffer::getSize(pBVar5);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"data: ",6);
    puVar2 = Buffer::getBuffer(pBVar5);
    poVar4 = std::operator<<((ostream *)&std::cout,puVar2);
    std::endl<char,std::char_traits<char>>(poVar4);
    Buffer::~Buffer(pBVar5);
    operator_delete(pBVar5,8);
    Pl_Buffer::Pl_Buffer(&local_98,"bp2",(Pipeline *)0x0);
    puVar2 = QUtil::unsigned_char_pointer("moo");
    Pl_Buffer::write(&local_98,(int)puVar2,(void *)0x3,in_RCX);
    puVar2 = QUtil::unsigned_char_pointer("quack");
    Pl_Buffer::write(&local_98,(int)puVar2,(void *)0x6,in_RCX);
    pBVar5 = Pl_Buffer::getBuffer(&local_98);
    if (pBVar5 != (Buffer *)0x0) {
      Buffer::~Buffer(pBVar5);
    }
    operator_delete(pBVar5,8);
    Pl_Buffer::finish(&local_98);
    pBVar5 = Pl_Buffer::getBuffer(&local_98);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"size: ",6);
    Buffer::getSize(pBVar5);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"data: ",6);
    puVar2 = Buffer::getBuffer(pBVar5);
    poVar4 = std::operator<<((ostream *)&std::cout,puVar2);
    std::endl<char,std::char_traits<char>>(poVar4);
    Buffer::~Buffer(pBVar5);
    operator_delete(pBVar5,8);
    Buffer::Buffer(&local_1c8,local_5a,10);
    puVar2 = Buffer::getBuffer(&local_1c8);
    if (puVar2 == local_5a) {
      sVar6 = Buffer::getSize(&local_1c8);
      if (sVar6 == 10) {
        Pl_Buffer::Pl_Buffer(&local_d0,"bp3",(Pipeline *)0x0);
        pBVar5 = Pl_Buffer::getBuffer(&local_d0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"size: ",6);
        Buffer::getSize(pBVar5);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::endl<char,std::char_traits<char>>(poVar4);
        Buffer::~Buffer(pBVar5);
        operator_delete(pBVar5,8);
        pBVar5 = Pl_Buffer::getBuffer(&local_d0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"size: ",6);
        Buffer::getSize(pBVar5);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::endl<char,std::char_traits<char>>(poVar4);
        Buffer::~Buffer(pBVar5);
        operator_delete(pBVar5,8);
        puVar2 = QUtil::unsigned_char_pointer("");
        Pl_Buffer::write(&local_d0,(int)puVar2,(void *)0x0,in_RCX);
        Pl_Buffer::finish(&local_d0);
        pBVar5 = Pl_Buffer::getBuffer(&local_d0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"size: ",6);
        Buffer::getSize(pBVar5);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::endl<char,std::char_traits<char>>(poVar4);
        Buffer::~Buffer(pBVar5);
        operator_delete(pBVar5,8);
        Pl_Buffer::Pl_Buffer(&local_108,"bp4",(Pipeline *)0x0);
        puVar2 = QUtil::unsigned_char_pointer("asdf");
        Pl_Buffer::write(&local_108,(int)puVar2,(void *)0x4,in_RCX);
        Pl_Buffer::getMallocBuffer(&local_108,&local_1e0,&local_1d0);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                      ,0x94,"int main()");
      }
    }
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"hand-created buffer is not as expected");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  __assert_fail("bm6p == bm5p",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                ,0x4f,"int main()");
}

Assistant:

int
main()
{
    // Test that buffers can be copied by value using Buffer::copy.
    Buffer bc1(2);
    unsigned char* bc1p = bc1.getBuffer();
    bc1p[0] = 'Q';
    bc1p[1] = 'W';
    Buffer bc2(bc1.copy());
    bc1p[0] = 'R';
    unsigned char* bc2p = bc2.getBuffer();
    assert(bc2p != bc1p);
    assert(bc2p[0] == 'Q');
    assert(bc2p[1] == 'W');
    bc2 = bc1.copy();
    bc2p = bc2.getBuffer();
    assert(bc2p != bc1p);
    assert(bc2p[0] == 'R');
    assert(bc2p[1] == 'W');

    // Test Buffer(std:string&&)
    Buffer bc3("QW");
    unsigned char* bc3p = bc3.getBuffer();
    Buffer bc4(bc3.copy());
    bc3p[0] = 'R';
    unsigned char* bc4p = bc4.getBuffer();
    assert(bc4p != bc3p);
    assert(bc4p[0] == 'Q');
    assert(bc4p[1] == 'W');
    bc4 = bc3.copy();
    bc4p = bc4.getBuffer();
    assert(bc4p != bc3p);
    assert(bc4p[0] == 'R');
    assert(bc4p[1] == 'W');

    // Test that buffers can be moved.
    Buffer bm1(2);
    unsigned char* bm1p = bm1.getBuffer();
    bm1p[0] = 'Q';
    bm1p[1] = 'W';
    Buffer bm2(std::move(bm1));
    bm1p[0] = 'R';
    unsigned char* bm2p = bm2.getBuffer();
    assert(bm2p == bm1p);
    assert(bm2p[0] == 'R');

    Buffer bm3 = std::move(bm2);
    unsigned char* bm3p = bm3.getBuffer();
    assert(bm3p == bm2p);

    // Test Buffer(dtd::string&&)
    Buffer bm4("QW");
    unsigned char* bm4p = bm4.getBuffer();
    Buffer bm5(std::move(bm4));
    bm4p[0] = 'R';
    unsigned char* bm5p = bm5.getBuffer();
    assert(bm5p == bm4p);
    assert(bm5p[0] == 'R');

    Buffer bm6 = std::move(bm5);
    unsigned char* bm6p = bm6.getBuffer();
    assert(bm6p == bm5p);

    try {
        Pl_Discard discard;
        Pl_Count count("count", &discard);
        Pl_Buffer bp1("bp1", &count);
        bp1.write(uc("12345"), 5);
        bp1.write(uc("67890"), 5);
        bp1.finish();
        std::cout << "count: " << count.getCount() << std::endl;
        bp1.write(uc("abcde"), 5);
        bp1.write(uc("fghij"), 6);
        bp1.finish();
        std::cout << "count: " << count.getCount() << std::endl;
        Buffer* b = bp1.getBuffer();
        std::cout << "size: " << b->getSize() << std::endl;
        std::cout << "data: " << b->getBuffer() << std::endl;
        delete b;
        bp1.write(uc("qwert"), 5);
        bp1.write(uc("yuiop"), 6);
        bp1.finish();
        std::cout << "count: " << count.getCount() << std::endl;
        b = bp1.getBuffer();
        std::cout << "size: " << b->getSize() << std::endl;
        std::cout << "data: " << b->getBuffer() << std::endl;
        delete b;

        Pl_Buffer bp2("bp2");
        bp2.write(uc("moo"), 3);
        bp2.write(uc("quack"), 6);
        try {
            delete bp2.getBuffer();
        } catch (std::exception& e) {
            std::cout << e.what() << std::endl;
        }
        bp2.finish();
        b = bp2.getBuffer();
        std::cout << "size: " << b->getSize() << std::endl;
        std::cout << "data: " << b->getBuffer() << std::endl;
        delete b;

        unsigned char lbuf[10];
        Buffer b1(lbuf, 10);
        if (!((b1.getBuffer() == lbuf) && (b1.getSize() == 10))) {
            throw std::logic_error("hand-created buffer is not as expected");
        }

        Pl_Buffer bp3("bp3");
        b = bp3.getBuffer();
        std::cout << "size: " << b->getSize() << std::endl;
        delete b;
        // Should be able to call getBuffer again and get an empty buffer
        b = bp3.getBuffer();
        std::cout << "size: " << b->getSize() << std::endl;
        delete b;
        // Also can write 0 and do it.
        bp3.write(uc(""), 0);
        bp3.finish();
        b = bp3.getBuffer();
        std::cout << "size: " << b->getSize() << std::endl;
        delete b;

        // Malloc buffer should behave similarly.
        Pl_Buffer bp4("bp4");
        bp4.write(uc("asdf"), 4);
        unsigned char* mbuf;
        size_t len;
        try {
            bp4.getMallocBuffer(&mbuf, &len);
            assert(false);
        } catch (std::logic_error& e) {
            std::cout << "malloc buffer logic error: " << e.what() << std::endl;
        }
        bp4.finish();
        bp4.getMallocBuffer(&mbuf, &len);
        assert(len == 4);
        assert(memcmp(mbuf, uc("asdf"), 4) == 0);
        free(mbuf);
        bp4.write(uc(""), 0);
        bp4.finish();
        bp4.getMallocBuffer(&mbuf, &len);
        assert(mbuf == nullptr);
        assert(len == 0);
    } catch (std::exception& e) {
        std::cout << "unexpected exception: " << e.what() << std::endl;
        exit(2);
    }

    std::cout << "done" << std::endl;
    return 0;
}